

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

deUint8 __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::checkLineWidths
          (LineRenderCase *this,ConstPixelBufferAccess *access,IVec2 *begin,IVec2 *end,
          int componentNdx,int *messageLimitCounter)

{
  int *piVar1;
  IVec2 *pIVar2;
  bool bVar3;
  uint uVar4;
  RenderTarget *pRVar5;
  byte bVar6;
  int detectedLineWidth;
  uint uVar7;
  int x;
  long lVar8;
  int *piVar9;
  int iVar10;
  int z;
  bool isHorizontal;
  IVec2 local_98;
  IVec2 *local_90;
  int local_88;
  int local_84;
  undefined8 local_80;
  uint local_74;
  LineRenderCase *local_70;
  IVec2 local_68;
  int *local_60;
  long local_58;
  int local_4c;
  int local_48 [4];
  ulong local_38;
  
  local_90 = begin;
  local_60 = messageLimitCounter;
  pRVar5 = Context::getRenderTarget((this->super_BBoxRenderCase).super_TestCase.m_context);
  pIVar2 = local_90;
  local_38 = 1;
  if (this->m_isWideLineCase != false) {
    local_38 = (ulong)(uint)this->m_wideLineLineWidth;
  }
  local_68.m_data[0] = (int)local_38;
  local_88 = local_68.m_data[0] + 1;
  local_84 = local_68.m_data[0];
  if (1 < pRVar5->m_numSamples) {
    local_84 = local_88;
  }
  isHorizontal = local_90->m_data[0] == end->m_data[0];
  uVar4 = (uint)isHorizontal;
  detectedLineWidth = 0;
  x = (int)access;
  local_70 = this;
  local_68.m_data[1] = local_84;
  tcu::ConstPixelBufferAccess::getPixelInt
            ((ConstPixelBufferAccess *)local_48,x,local_90->m_data[0],local_90->m_data[1]);
  local_58 = (long)componentNdx;
  local_98.m_data[0] = pIVar2->m_data[0];
  local_98.m_data[1] = pIVar2->m_data[1];
  uVar7 = (uint)!isHorizontal;
  local_74 = uVar7;
  if (local_48[local_58] == 0) {
    local_90 = (IVec2 *)((ulong)local_90 & 0xffffffff00000000);
  }
  else {
    iVar10 = local_98.m_data[0] - uVar7;
    if (iVar10 < 0) {
      detectedLineWidth = 0;
    }
    else {
      z = local_98.m_data[1] - uVar4;
      detectedLineWidth = 0;
      do {
        if ((z < 0) ||
           (tcu::ConstPixelBufferAccess::getPixelInt((ConstPixelBufferAccess *)local_48,x,iVar10,z),
           local_48[local_58] == 0)) break;
        detectedLineWidth = detectedLineWidth + 1;
        z = z - uVar4;
        iVar10 = iVar10 - uVar7;
      } while (-1 < iVar10);
    }
    local_98.m_data[0] = local_90->m_data[0];
    local_98.m_data[1] = local_90->m_data[1];
    local_90 = (IVec2 *)CONCAT44(local_90._4_4_,(int)CONCAT71((int7)((ulong)local_90 >> 8),1));
  }
  local_4c = (int)local_38 + -1;
  local_80 = 0;
  do {
    uVar7 = local_74;
    bVar3 = true;
    lVar8 = 0;
    piVar9 = local_98.m_data;
    do {
      iVar10 = *piVar9;
      piVar1 = end->m_data + lVar8;
      if (!bVar3) break;
      lVar8 = 1;
      bVar3 = false;
      piVar9 = local_98.m_data + 1;
    } while (iVar10 == *piVar1);
    if (iVar10 == *piVar1) break;
    tcu::ConstPixelBufferAccess::getPixelInt
              ((ConstPixelBufferAccess *)local_48,x,local_98.m_data[0],local_98.m_data[1]);
    if (local_48[local_58] == 0) {
      if (detectedLineWidth != 0) {
        if ((((int)local_38 <= detectedLineWidth) || (((ulong)local_90 & 1) != 0)) &&
           (detectedLineWidth <= local_84)) {
          local_90 = (IVec2 *)((ulong)local_90 & 0xffffffff00000000);
          detectedLineWidth = 0;
          goto LAB_0164cfea;
        }
        if (((local_4c <= detectedLineWidth) || (bVar6 = 8, ((ulong)local_90 & 1) != 0)) &&
           (bVar6 = 8, detectedLineWidth <= local_88)) {
          bVar6 = 4;
        }
        local_80 = CONCAT71((int7)((ulong)local_80 >> 8),(byte)local_80 | bVar6);
        printLineWidthError((LineRenderCase *)
                            (local_70->super_BBoxRenderCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx,&local_98,detectedLineWidth,&local_68,
                            isHorizontal,local_60);
        local_90 = (IVec2 *)((ulong)local_90 & 0xffffffff00000000);
      }
      detectedLineWidth = 0;
    }
    else {
      detectedLineWidth = detectedLineWidth + 1;
    }
LAB_0164cfea:
    local_98.m_data[0] = local_98.m_data[0] + local_74;
    local_98.m_data[1] = local_98.m_data[1] + uVar4;
  } while( true );
  if (detectedLineWidth != 0) {
    local_98.m_data[0] = end->m_data[0];
    local_98.m_data[1] = end->m_data[1];
    if (local_98.m_data[0] < (access->m_size).m_data[0]) {
      do {
        if ((access->m_size).m_data[1] <= local_98.m_data[1]) break;
        tcu::ConstPixelBufferAccess::getPixelInt
                  ((ConstPixelBufferAccess *)local_48,x,local_98.m_data[0],local_98.m_data[1]);
        if (local_48[local_58] == 0) {
          iVar10 = 0;
          if ((detectedLineWidth != 0) && (local_84 < detectedLineWidth)) {
            local_80 = CONCAT71((int7)((ulong)local_80 >> 8),
                                (byte)local_80 | (local_88 < detectedLineWidth) * '\x04' + 4U);
            printLineWidthError((LineRenderCase *)
                                (local_70->super_BBoxRenderCase).super_TestCase.super_TestCase.
                                super_TestNode.m_testCtx,&local_98,detectedLineWidth,&local_68,
                                isHorizontal,local_60);
          }
        }
        else {
          iVar10 = detectedLineWidth + 1;
        }
        detectedLineWidth = iVar10;
        local_98.m_data[0] = local_98.m_data[0] + uVar7;
        local_98.m_data[1] = local_98.m_data[1] + uVar4;
      } while (local_98.m_data[0] < (access->m_size).m_data[0]);
    }
    if (local_84 < detectedLineWidth) {
      bVar6 = (local_88 < detectedLineWidth) * '\x04' + 4U | (byte)local_80;
      printLineWidthError((LineRenderCase *)
                          (local_70->super_BBoxRenderCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx,&local_98,detectedLineWidth,&local_68,
                          isHorizontal,local_60);
      return bVar6;
    }
  }
  return (deUint8)local_80;
}

Assistant:

deUint8 LineRenderCase::checkLineWidths (const tcu::ConstPixelBufferAccess& access, const tcu::IVec2& begin, const tcu::IVec2& end, int componentNdx, int& messageLimitCounter) const
{
	const bool			multisample				= m_context.getRenderTarget().getNumSamples() > 1;
	const int			lineRenderWidth			= (m_isWideLineCase) ? (m_wideLineLineWidth) : 1;
	const tcu::IVec2	lineWidthRange			= (multisample)
													? (tcu::IVec2(lineRenderWidth, lineRenderWidth+1))	// multisampled "smooth" lines may spread to neighboring pixel
													: (tcu::IVec2(lineRenderWidth, lineRenderWidth));
	const tcu::IVec2	relaxedLineWidthRange	= (tcu::IVec2(lineRenderWidth-1, lineRenderWidth+1));

	int					lineWidth				= 0;
	bool				bboxLimitedLine			= false;
	deUint8				errorMask				= 0;

	const tcu::IVec2	advance					= (begin.x() == end.x()) ? (tcu::IVec2(0, 1)) : (tcu::IVec2(1, 0));

	// fragments before begin?
	if (access.getPixelInt(begin.x(), begin.y())[componentNdx] != 0)
	{
		bboxLimitedLine = true;

		for (tcu::IVec2 cursor = begin - advance;; cursor -= advance)
		{
			if (cursor.x() < 0 || cursor.y() < 0)
			{
				break;
			}
			else if (access.getPixelInt(cursor.x(), cursor.y())[componentNdx] != 0)
			{
				++lineWidth;
			}
			else
				break;
		}
	}

	for (tcu::IVec2 cursor = begin; cursor != end; cursor += advance)
	{
		const bool hit = (access.getPixelInt(cursor.x(), cursor.y())[componentNdx] != 0);

		if (hit)
			++lineWidth;
		else if (lineWidth)
		{
			// Line is allowed to be be thinner if it borders the bbox boundary (since part of the line might have been discarded).
			const bool incorrectLineWidth = (lineWidth < lineWidthRange.x() && !bboxLimitedLine) || (lineWidth > lineWidthRange.y());

			if (incorrectLineWidth)
			{
				const bool incorrectRelaxedLineWidth = (lineWidth < relaxedLineWidthRange.x() && !bboxLimitedLine) || (lineWidth > relaxedLineWidthRange.y());

				if (incorrectRelaxedLineWidth)
					errorMask |= SCANRESULT_LINE_WIDTH_ERR_BIT;
				else
					errorMask |= SCANRESULT_LINE_WIDTH_WARN_BIT;

				printLineWidthError(cursor, lineWidth, lineWidthRange, advance.x() == 0, messageLimitCounter);
			}

			lineWidth = 0;
			bboxLimitedLine = false;
		}
	}

	// fragments after end?
	if (lineWidth)
	{
		for (tcu::IVec2 cursor = end;; cursor += advance)
		{
			if (cursor.x() >= access.getWidth() || cursor.y() >= access.getHeight())
			{
				if (lineWidth > lineWidthRange.y())
				{
					if (lineWidth > relaxedLineWidthRange.y())
						errorMask |= SCANRESULT_LINE_WIDTH_ERR_BIT;
					else
						errorMask |= SCANRESULT_LINE_WIDTH_WARN_BIT;

					printLineWidthError(cursor, lineWidth, lineWidthRange, advance.x() == 0, messageLimitCounter);
				}

				break;
			}
			else if (access.getPixelInt(cursor.x(), cursor.y())[componentNdx] != 0)
			{
				++lineWidth;
			}
			else if (lineWidth)
			{
				// only check that line width is not larger than expected. Line width may be smaller
				// since the scanning 'cursor' is now outside the bounding box.
				const bool incorrectLineWidth = (lineWidth > lineWidthRange.y());

				if (incorrectLineWidth)
				{
					const bool incorrectRelaxedLineWidth = (lineWidth > relaxedLineWidthRange.y());

					if (incorrectRelaxedLineWidth)
						errorMask |= SCANRESULT_LINE_WIDTH_ERR_BIT;
					else
						errorMask |= SCANRESULT_LINE_WIDTH_WARN_BIT;

					printLineWidthError(cursor, lineWidth, lineWidthRange, advance.x() == 0, messageLimitCounter);
				}

				lineWidth = 0;
			}
		}
	}

	return errorMask;
}